

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_xmove(lua_State *from,lua_State *to,int n)

{
  StkId pSVar1;
  StkId pSVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (from != to) {
    (from->top).p = (from->top).p + -(long)n;
    uVar4 = 0;
    uVar3 = (ulong)(uint)n;
    if (n < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
      pSVar1 = (to->top).p;
      pSVar2 = (from->top).p;
      (pSVar1->val).value_ = *(Value *)((long)pSVar2 + uVar4);
      (pSVar1->val).tt_ = *(lu_byte *)((long)pSVar2 + uVar4 + 8);
      (to->top).p = (StkId)((to->top).offset + 0x10);
    }
  }
  return;
}

Assistant:

LUA_API void lua_xmove (lua_State *from, lua_State *to, int n) {
  int i;
  if (from == to) return;
  lua_lock(to);
  api_checknelems(from, n);
  api_check(from, G(from) == G(to), "moving among independent states");
  api_check(from, to->ci->top.p - to->top.p >= n, "stack overflow");
  from->top.p -= n;
  for (i = 0; i < n; i++) {
    setobjs2s(to, to->top.p, from->top.p + i);
    to->top.p++;  /* stack already checked by previous 'api_check' */
  }
  lua_unlock(to);
}